

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cc
# Opt level: O2

void __thiscall tt::FileUtil::AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = mywrite(this,logline,len);
  do {
    if (len - sVar2 == 0) {
      return;
    }
    sVar3 = mywrite(this,logline + sVar2,len - sVar2);
    sVar2 = sVar2 + sVar3;
  } while (sVar3 != 0);
  iVar1 = ferror((FILE *)this->m_fp);
  if (iVar1 == 0) {
    return;
  }
  fwrite("AppendFile::append() failed !\n",0x1e,1,_stderr);
  return;
}

Assistant:

void FileUtil::AppendFile::append(const char* logline,const size_t len){
	size_t n = mywrite(logline,len);
	size_t remain = len - n;

	while( remain > 0){
		size_t x = mywrite(logline + n, remain);

		if(x == 0){
			int err = ferror(m_fp);
			if(err) fprintf(stderr,"AppendFile::append() failed !\n");
			break;
		}
		n += x;
		remain = len - n;
	}
}